

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

void __thiscall ObjLoader::loadImage(ObjLoader *this,string *texture_filename)

{
  bool bVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  Image<unsigned_char> image;
  string key;
  
  std::__cxx11::string::string((string *)&key,texture_filename);
  if (texture_filename->_M_string_length != 0) {
    bVar1 = NamedTextureImages::find(&this->m_images,&key);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image,
                     &this->m_rootDir,texture_filename);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (texture_filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image);
      std::__cxx11::string::~string((string *)&image);
      bVar1 = fileExists(texture_filename);
      if (bVar1) {
        image.data = (uchar *)0x0;
        image.width = 0;
        image.height = 0;
        image.depth = 1;
        image.channels = 0;
        image.data = stbi_load((texture_filename->_M_dataplus)._M_p,&image.width,&image.height,
                               &image.channels,0);
        if (image.data != (stbi_uc *)0x0) {
          pmVar2 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->m_images,&key);
          pmVar2->data = image.data;
          pmVar2->width = image.width;
          pmVar2->height = image.height;
          pmVar2->depth = image.depth;
          pmVar2->channels = image.channels;
          goto LAB_001235dc;
        }
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to load texture: ");
        poVar3 = std::operator<<(poVar3,(string *)texture_filename);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to find file: ");
        poVar3 = std::operator<<(poVar3,(string *)texture_filename);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      exit(1);
    }
  }
LAB_001235dc:
  std::__cxx11::string::~string((string *)&key);
  return;
}

Assistant:

void ObjLoader::loadImage(std::string texture_filename)
{
  std::string key = texture_filename;
  if (texture_filename.length() > 0) {
    // Only load the texture if it is not already loaded
    if (not m_images.find(key)) {
      texture_filename = m_rootDir + texture_filename;
      if (!fileExists(texture_filename)) {
        std::cerr << "Unable to find file: " << texture_filename << std::endl;
        exit(1);
      }

      Image<> image;
      image.depth = 1;
      image.data = stbi_load(texture_filename.c_str(), &image.width, &image.height, &image.channels, STBI_default);
      if (!image.data) {
        std::cerr << "Unable to load texture: " << texture_filename << std::endl;
        exit(1);
      }
      m_images.add(key, image);
    }
  }
}